

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fw_data_parser.c
# Opt level: O0

int image_fwdata_get_buffer(igsc_fwdata_image *img,uint8_t **buffer,uint32_t *buffer_len)

{
  uint32_t *buffer_len_local;
  uint8_t **buffer_local;
  igsc_fwdata_image *img_local;
  
  if (((img == (igsc_fwdata_image *)0x0) || (buffer == (uint8_t **)0x0)) ||
     (buffer_len == (uint32_t *)0x0)) {
    img_local._4_4_ = 3;
  }
  else if ((img->buffer == (uint8_t *)0x0) || (img->buffer_len == 0)) {
    img_local._4_4_ = 5;
  }
  else {
    *buffer = img->buffer;
    *buffer_len = img->buffer_len;
    img_local._4_4_ = 0;
  }
  return img_local._4_4_;
}

Assistant:

int image_fwdata_get_buffer(struct igsc_fwdata_image *img,
                            const uint8_t **buffer,
                            uint32_t *buffer_len)
{
    if (img == NULL || buffer == NULL || buffer_len == NULL )
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    if (img->buffer == NULL || img->buffer_len == 0)
    {
        return IGSC_ERROR_BAD_IMAGE;
    }

    *buffer = img->buffer;
    *buffer_len = img->buffer_len;

    return IGSC_SUCCESS;
}